

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# split.c
# Opt level: O3

IceTImage icetSplitCompose(void)

{
  IceTInt tile;
  IceTImage image;
  int *piVar1;
  IceTBoolean IVar2;
  int iVar3;
  IceTSizeType IVar4;
  IceTEnum IVar5;
  IceTEnum IVar6;
  IceTInt *pIVar7;
  IceTInt *pIVar8;
  IceTBoolean *pIVar9;
  IceTImage IVar10;
  IceTVoid *pIVar11;
  IceTCommRequest pIVar12;
  IceTSparseImage IVar13;
  int iVar14;
  int iVar15;
  ulong uVar16;
  int pixels;
  bool bVar17;
  long lVar18;
  ulong uVar19;
  float fVar20;
  float fVar21;
  IceTInt num_tiles;
  IceTSizeType package_size;
  IceTSizeType pixel_size;
  IceTInt num_proc;
  IceTInt max_height;
  IceTInt max_width;
  IceTInt num_contained_tiles;
  IceTInt rank;
  IceTInt tile_displayed;
  IceTInt total_image_count;
  IceTVoid *package_buffer;
  int local_d8;
  IceTSizeType local_d4;
  int local_d0;
  int local_cc;
  IceTBoolean *local_c8;
  int local_c0;
  int local_bc;
  ulong local_b8;
  int local_b0;
  int local_ac;
  IceTImage local_a8;
  ulong local_a0;
  IceTInt *local_98;
  int *local_90;
  int local_84;
  int local_80;
  int local_7c;
  IceTCommRequest local_78;
  IceTCommRequest local_70 [2];
  IceTImage local_60;
  IceTCommRequest *local_58;
  IceTVoid *local_50;
  IceTInt *local_48;
  long local_40;
  IceTSparseImage local_38;
  
  icetGetIntegerv(2,&local_ac);
  icetGetIntegerv(3,&local_cc);
  icetGetIntegerv(0x10,&local_d8);
  icetGetIntegerv(0x13,&local_bc);
  icetGetIntegerv(0x14,&local_c0);
  pIVar7 = icetUnsafeStateGetInteger(0x8a);
  icetGetIntegerv(0x8b,&local_7c);
  icetGetIntegerv(0x1b,&local_80);
  pIVar8 = icetUnsafeStateGetInteger(0x11);
  icetGetIntegerv(0x86,&local_b0);
  local_48 = icetUnsafeStateGetInteger(0x87);
  pIVar9 = icetUnsafeStateGetBoolean(0x89);
  IVar10 = icetImageNull();
  if (local_7c < 1) {
    if (-1 < local_80) {
      IVar10 = icetGetStateBufferImage
                         (0x1a4,pIVar8[(ulong)(uint)(local_80 << 2) + 2],
                          pIVar8[(ulong)(uint)(local_80 << 2) + 3]);
      icetClearImage(IVar10);
    }
  }
  else {
    local_90 = (int *)icetGetStateBuffer(0x1a6,local_d8 * 4 + 4);
    *local_90 = 0;
    if (local_d8 < 1) {
      iVar14 = 0;
    }
    else {
      lVar18 = 0;
      iVar14 = 0;
      do {
        iVar3 = (local_cc * pIVar7[lVar18]) / local_7c;
        iVar15 = 1;
        if (1 < iVar3) {
          iVar15 = iVar3;
        }
        if (pIVar7[lVar18] < 1) {
          iVar15 = iVar3;
        }
        local_90[lVar18 + 1] = iVar15;
        lVar18 = lVar18 + 1;
        iVar14 = iVar14 + iVar15;
      } while (lVar18 < local_d8);
    }
    for (; iVar14 < local_cc; iVar14 = iVar14 + 1) {
      if ((long)local_d8 < 1) {
        lVar18 = -1;
      }
      else {
        fVar20 = (float)local_cc;
        uVar16 = 0xffffffff;
        uVar19 = 0;
        do {
          if ((pIVar7[uVar19] != 0) &&
             (fVar21 = (float)local_90[uVar19 + 1] / (float)pIVar7[uVar19], fVar21 < fVar20)) {
            uVar16 = uVar19 & 0xffffffff;
            fVar20 = fVar21;
          }
          uVar19 = uVar19 + 1;
        } while ((long)local_d8 != uVar19);
        lVar18 = (long)(int)uVar16;
      }
      local_90[lVar18 + 1] = local_90[lVar18 + 1] + 1;
    }
    for (; local_cc < iVar14; iVar14 = iVar14 + -1) {
      if ((long)local_d8 < 1) {
        lVar18 = -1;
      }
      else {
        uVar16 = 0xffffffff;
        fVar20 = 0.0;
        uVar19 = 0;
        do {
          if ((1 < local_90[uVar19 + 1]) &&
             (fVar21 = (float)local_90[uVar19 + 1] / (float)pIVar7[uVar19], fVar20 < fVar21)) {
            uVar16 = uVar19 & 0xffffffff;
            fVar20 = fVar21;
          }
          uVar19 = uVar19 + 1;
        } while ((long)local_d8 != uVar19);
        lVar18 = (long)(int)uVar16;
      }
      local_90[lVar18 + 1] = local_90[lVar18 + 1] + -1;
    }
    if (1 < local_d8) {
      iVar14 = *local_90;
      lVar18 = 1;
      do {
        iVar14 = iVar14 + local_90[lVar18];
        local_90[lVar18] = iVar14;
        lVar18 = lVar18 + 1;
      } while (lVar18 < local_d8);
    }
    local_90[local_d8] = local_cc;
    local_a0 = 0xffffffffffffffff;
    do {
      lVar18 = local_a0 + 2;
      local_a0 = local_a0 + 1;
    } while (local_90[lVar18] <= local_ac);
    uVar16 = local_a0 & 0xffffffff;
    iVar15 = local_90[lVar18] - local_90[uVar16];
    iVar15 = (local_c0 * local_bc + iVar15 + -1) / iVar15;
    iVar14 = pIVar7[uVar16];
    local_c8 = pIVar9;
    IVar4 = icetSparseImageBufferSize(iVar15,1);
    local_50 = icetGetStateBuffer(0x1a1,pIVar7[uVar16] << 3);
    local_38 = icetGetStateBufferSparseImage(0x1a2,local_bc,local_c0);
    local_84 = iVar15;
    local_a8 = icetGetStateBufferImage(0x1a3,iVar15,1);
    IVar10 = icetGetStateBufferImage(0x1a4,local_bc,local_c0);
    local_58 = (IceTCommRequest *)icetGetStateBuffer(0x1a5,iVar14 << 3);
    pIVar11 = icetGetStateBuffer(0x1a0,pIVar7[uVar16] * IVar4);
    iVar14 = pIVar7[uVar16];
    local_b8 = uVar16;
    local_98 = pIVar7;
    if (0 < iVar14) {
      iVar3 = 0;
      iVar15 = 0;
      uVar16 = local_a0;
      do {
        if (local_c8[local_d8 * iVar15 + (int)uVar16] != '\0') {
          *(IceTVoid **)((long)local_50 + (long)iVar3 * 8) = pIVar11;
          pIVar12 = icetCommIrecv(pIVar11,IVar4,0x8001,iVar15,0x32);
          local_58[iVar3] = pIVar12;
          iVar3 = iVar3 + 1;
          pIVar11 = (IceTVoid *)((long)pIVar11 + (long)IVar4);
          iVar14 = local_98[local_b8];
          uVar16 = local_a0;
        }
        iVar15 = iVar15 + 1;
      } while (iVar3 < iVar14);
    }
    IVar13.opaque_internals = local_38.opaque_internals;
    if (0 < local_b0) {
      lVar18 = 0;
      do {
        tile = local_48[lVar18];
        local_40 = lVar18;
        icetGetTileImage(tile,IVar10);
        IVar4 = icetImageGetNumPixels(IVar10);
        local_c8 = (IceTBoolean *)(long)tile;
        iVar14 = local_90[(long)local_c8];
        iVar15 = local_90[(long)(local_c8 + 1)] - iVar14;
        iVar15 = (IVar4 + iVar15 + -1) / iVar15;
        if (iVar14 < local_90[(long)(local_c8 + 1)]) {
          iVar3 = 0;
          do {
            IVar4 = icetImageGetNumPixels(IVar10);
            pixels = iVar15;
            if (IVar4 - iVar3 < iVar15) {
              IVar4 = icetImageGetNumPixels(IVar10);
              pixels = IVar4 - iVar3;
            }
            icetCompressSubImage(IVar10,iVar3,pixels,IVar13);
            icetSparseImagePackageForSend(IVar13,&local_78,&local_d4);
            icetCommSend(local_78,local_d4,0x8001,iVar14,0x32);
            iVar3 = iVar3 + pixels;
            iVar14 = iVar14 + 1;
          } while (iVar14 < local_90[(long)(local_c8 + 1)]);
        }
        lVar18 = local_40 + 1;
      } while (lVar18 < local_b0);
      iVar14 = local_98[local_b8];
    }
    piVar1 = local_90;
    pIVar7 = local_98;
    image.opaque_internals = local_a8.opaque_internals;
    uVar16 = local_b8;
    local_60 = IVar10;
    if (0 < iVar14) {
      iVar15 = 0;
      bVar17 = false;
      do {
        iVar14 = icetCommWaitany(iVar14,local_58);
        IVar13 = icetSparseImageUnpackageFromReceive
                           (*(IceTVoid **)((long)local_50 + (long)iVar14 * 8));
        if (bVar17) {
          icetCompressedComposite(image,IVar13,1);
        }
        else {
          icetDecompressImage(IVar13,image);
        }
        iVar15 = iVar15 + 1;
        iVar14 = pIVar7[uVar16];
        bVar17 = true;
      } while (iVar15 < iVar14);
    }
    IVar2 = icetIsEnabled(0x146);
    if (IVar2 == '\0') {
      iVar14 = (local_ac - piVar1[uVar16]) * local_84;
      IVar4 = icetImageGetNumPixels(image);
      IVar10.opaque_internals = local_60.opaque_internals;
      icetImageCopyPixels(image,0,local_60,iVar14,IVar4);
      icetStateSetInteger(0x8c,(IceTInt)local_a0);
      icetStateSetInteger(0x8d,iVar14);
      icetStateSetInteger(0x8e,IVar4);
    }
    else {
      icetGetIntegerv(0x1b,&local_d4);
      pIVar7 = icetUnsafeStateGetInteger(0x11);
      pIVar8 = icetUnsafeStateGetInteger(0x1a);
      IVar4 = icetImageGetNumPixels(image);
      icetImageAdjustForOutput(image);
      IVar5 = icetImageGetColorFormat(image);
      IVar6 = icetImageGetDepthFormat(image);
      local_c8 = (IceTBoolean *)CONCAT44(local_c8._4_4_,IVar6);
      icetTimingCollectBegin();
      if (IVar5 != 0xc000) {
        pIVar11 = icetImageGetColorVoid(local_a8,&local_d0);
        local_78 = icetCommIsend(pIVar11,local_d0 * IVar4,0x8001,pIVar8[local_b8],0x33);
      }
      if ((int)local_c8 != 0xd000) {
        pIVar11 = icetImageGetDepthVoid(local_a8,&local_d0);
        local_70[0] = icetCommIsend(pIVar11,IVar4 * local_d0,0x8001,pIVar8[local_b8],0x34);
      }
      IVar10.opaque_internals = local_60.opaque_internals;
      if (-1 < local_d4) {
        IVar4 = pIVar7[(ulong)(uint)(local_d4 << 2) + 2];
        iVar14 = pIVar7[(ulong)(uint)(local_d4 << 2) + 3];
        icetImageAdjustForOutput(local_60);
        icetImageSetDimensions(IVar10,IVar4,iVar14);
        iVar15 = piVar1[(long)local_d4 + 1] - piVar1[local_d4];
        if (iVar15 == 0 || piVar1[(long)local_d4 + 1] < piVar1[local_d4]) {
          icetClearImage(IVar10);
        }
        else {
          iVar15 = (iVar14 * IVar4 + iVar15 + -1) / iVar15;
          if (IVar5 != 0xc000) {
            pIVar11 = icetImageGetColorVoid(IVar10,&local_d0);
            iVar14 = piVar1[local_d4];
            if (iVar14 < piVar1[(long)local_d4 + 1]) {
              do {
                icetCommRecv(pIVar11,local_d0 * iVar15,0x8001,iVar14,0x33);
                pIVar11 = (IceTVoid *)((long)pIVar11 + (long)(local_d0 * iVar15));
                iVar14 = iVar14 + 1;
              } while (iVar14 < piVar1[(long)local_d4 + 1]);
            }
          }
          if ((int)local_c8 != 0xd000) {
            pIVar11 = icetImageGetDepthVoid(IVar10,&local_d0);
            iVar14 = piVar1[local_d4];
            if (iVar14 < piVar1[(long)local_d4 + 1]) {
              do {
                icetCommRecv(pIVar11,local_d0 * iVar15,0x8003,iVar14,0x34);
                pIVar11 = (IceTVoid *)((long)pIVar11 + (long)(local_d0 * iVar15));
                iVar14 = iVar14 + 1;
              } while (iVar14 < piVar1[(long)local_d4 + 1]);
            }
          }
        }
      }
      if (IVar5 != 0xc000) {
        icetCommWait(&local_78);
      }
      if ((int)local_c8 != 0xd000) {
        icetCommWait(local_70);
      }
      icetTimingCollectEnd();
    }
  }
  return (IceTImage)IVar10.opaque_internals;
}

Assistant:

IceTImage icetSplitCompose(void)
{
    IceTInt *tile_groups;
    IceTInt my_tile;
    IceTInt group_size;
    IceTSizeType my_fragment_size;

    IceTInt rank;
    IceTInt num_proc;
    IceTInt num_tiles;
    IceTInt max_width, max_height;
    const IceTInt *tile_contribs;
    IceTInt total_image_count;
    IceTInt tile_displayed;
    const IceTInt *tile_viewports;
    IceTInt my_width, my_height;

    IceTInt num_contained_tiles;
    const IceTInt *contained_tiles_list;
    const IceTBoolean *all_contained_tiles_masks;

    int tile, image, node;
    int num_allocated;

    IceTSparseImage incoming;
    IceTVoid **incomingBuffers;
    IceTByte *nextInBuf;  /* Use IceTByte for byte-based pointer arithmetic. */
    IceTSparseImage outgoing;
    IceTImage imageFragment;
    IceTImage fullImage;

    IceTSizeType fragmentSparseImageSize;

    int num_requests;
    IceTCommRequest *requests;

    int first_incoming;

    icetRaiseDebug("In splitStrategy");

    icetGetIntegerv(ICET_RANK, &rank);
    icetGetIntegerv(ICET_NUM_PROCESSES, &num_proc);
    icetGetIntegerv(ICET_NUM_TILES, &num_tiles);
    icetGetIntegerv(ICET_TILE_MAX_WIDTH, &max_width);
    icetGetIntegerv(ICET_TILE_MAX_HEIGHT, &max_height);
    tile_contribs = icetUnsafeStateGetInteger(ICET_TILE_CONTRIB_COUNTS);
    icetGetIntegerv(ICET_TOTAL_IMAGE_COUNT, &total_image_count);
    icetGetIntegerv(ICET_TILE_DISPLAYED, &tile_displayed);
    tile_viewports = icetUnsafeStateGetInteger(ICET_TILE_VIEWPORTS);
    icetGetIntegerv(ICET_NUM_CONTAINED_TILES, &num_contained_tiles);
    contained_tiles_list = icetUnsafeStateGetInteger(ICET_CONTAINED_TILES_LIST);
    all_contained_tiles_masks
        = icetUnsafeStateGetBoolean(ICET_ALL_CONTAINED_TILES_MASKS);

    fullImage = icetImageNull();

  /* Special case: no images rendered whatsoever. */
    if (total_image_count < 1) {
        icetRaiseDebug("Not rendering any images.  Quit early.");
        if (tile_displayed >= 0) {
            my_width = tile_viewports[4*tile_displayed + 2];
            my_height = tile_viewports[4*tile_displayed + 3];
            fullImage = icetGetStateBufferImage(SPLIT_FULL_IMAGE_BUFFER,
                                                my_width, my_height);
            icetClearImage(fullImage);
        }
        return fullImage;
    }

    tile_groups = icetGetStateBuffer(SPLIT_TILE_GROUPS_BUFFER,
                                     sizeof(int)*(num_tiles+1));

    num_allocated = 0;
    tile_groups[0] = 0;
  /* Set entry of tile_groups[i+1] to the number of processes to help
     compose the image in tile i. */
  /* TODO: Consider tile sizes when allocating processes. */
    for (tile = 0; tile < num_tiles; tile++) {
        int allocate = (tile_contribs[tile]*num_proc)/total_image_count;
        if ((allocate < 1) && (tile_contribs[tile] > 0)) {
            allocate = 1;
        }
        tile_groups[tile+1] = allocate;
        num_allocated += allocate;
    }

  /* Make the number of processes allocated equal exactly the number of
     processes available. */
    while (num_allocated < num_proc) {
      /* Add processes to the tile with the lowest process:image ratio. */
        int min_id = -1;
        float min_ratio = (float)num_proc;
        for (tile = 0; tile < num_tiles; tile++) {
            float ratio;
          /* Don't even consider tiles with no contributors. */
            if (tile_contribs[tile] == 0) continue;
            ratio = (float)tile_groups[tile+1]/tile_contribs[tile];
            if (ratio < min_ratio) {
                min_ratio = ratio;
                min_id = tile;
            }
        }
#ifdef DEBUG
        if (min_id < 0) {
            icetRaiseError("Could not find candidate to add tile.",
                           ICET_SANITY_CHECK_FAIL);
        }
#endif
        tile_groups[min_id+1]++;
        num_allocated++;
    }
    while (num_allocated > num_proc) {
      /* Remove processes from the tile with the highest process:image
         ratio. */
        int max_id = -1;
        float max_ratio = 0;
        for (tile = 0; tile < num_tiles; tile++) {
            float ratio;
          /* Don't even consider tiles with a minimum allocation. */
            if (tile_groups[tile+1] <= 1) continue;
            ratio = (float)tile_groups[tile+1]/tile_contribs[tile];
            if (ratio > max_ratio) {
                max_ratio = ratio;
                max_id = tile;
            }
        }
#ifdef DEBUG
        if (max_id < 0) {
            icetRaiseError("Could not find candidate to remove tile.",
                           ICET_SANITY_CHECK_FAIL);
        }
#endif
        tile_groups[max_id+1]--;
        num_allocated--;
    }

  /* Processes are assigned sequentially from 0 to N to each tile as
     needed.  Change each tile_groups[i] entry to be the lowest rank of the
     processes assigned to tile i.  Thus the processes assigned to tile i
     are tile_groups[i] through tile_groups[i+1]-1. */
    for (tile = 1; tile < num_tiles; tile++) {
        tile_groups[tile] += tile_groups[tile-1];
    }
    tile_groups[num_tiles] = num_proc;

  /* Figure out which tile I am assigned to. */
    for (my_tile = 0; rank >= tile_groups[my_tile+1]; my_tile++);
    icetRaiseDebug1("My tile is %d", my_tile);

    group_size = tile_groups[my_tile+1] - tile_groups[my_tile];
    my_width = tile_viewports[4*my_tile + 2];
    my_height = tile_viewports[4*my_tile + 3];
    my_fragment_size = FRAG_SIZE(max_width*max_height, group_size);

    num_requests = tile_contribs[my_tile];

    fragmentSparseImageSize = icetSparseImageBufferSize(my_fragment_size, 1);

    incomingBuffers
        = icetGetStateBuffer(SPLIT_INCOMING_ARRAY_BUFFER,
                             sizeof(IceTVoid*)*tile_contribs[my_tile]);
    outgoing      = icetGetStateBufferSparseImage(SPLIT_OUTGOING_BUFFER,
                                                  max_width, max_height);
    imageFragment = icetGetStateBufferImage(SPLIT_IMAGE_FRAGMENT_BUFFER,
                                            my_fragment_size, 1);
    fullImage     = icetGetStateBufferImage(SPLIT_FULL_IMAGE_BUFFER,
                                            max_width, max_height);
    requests = icetGetStateBuffer(SPLIT_REQUEST_BUFFER,
                                  sizeof(IceTCommRequest)*num_requests);

  /* Set up asynchronous receives for all incoming image fragments. */
    nextInBuf = icetGetStateBuffer(SPLIT_INCOMING_BUFFERS,
                                fragmentSparseImageSize*tile_contribs[my_tile]);
    for (image = 0, node = 0; image < tile_contribs[my_tile]; node++) {
        if (all_contained_tiles_masks[node*num_tiles + my_tile]) {
            icetRaiseDebug1("Setting up receive from node %d", node);
            incomingBuffers[image] = nextInBuf;
            requests[image] =
                icetCommIrecv(incomingBuffers[image],
                              fragmentSparseImageSize,
                              ICET_BYTE, node, IMAGE_DATA);
            image++;
            nextInBuf += fragmentSparseImageSize;
        }
    }

  /* Render and send all tile images I am rendering. */
    for (image = 0; image < num_contained_tiles; image++) {
        IceTSizeType sending_frag_size;
        IceTSizeType offset;

        tile = contained_tiles_list[image];
        icetGetTileImage(tile, fullImage);
        icetRaiseDebug1("Rendered image for tile %d", tile);
        offset = 0;
        sending_frag_size = FRAG_SIZE(icetImageGetNumPixels(fullImage),
                                      tile_groups[tile+1]-tile_groups[tile]);
        for (node = tile_groups[tile]; node < tile_groups[tile+1]; node++) {
            IceTVoid *package_buffer;
            IceTSizeType package_size;
            IceTSizeType truncated_size;

            truncated_size = MIN(sending_frag_size,
                                 icetImageGetNumPixels(fullImage) - offset);

            icetRaiseDebug2("Sending tile %d to node %d", tile, node);
            icetRaiseDebug2("Pixels %d to %d",
                            (int)offset, (int)truncated_size-1);
            icetCompressSubImage(fullImage, offset,
                                 truncated_size, outgoing);
            icetSparseImagePackageForSend(outgoing,
                                          &package_buffer, &package_size);
            icetCommSend(package_buffer, package_size,
                         ICET_BYTE, node, IMAGE_DATA);
            offset += truncated_size;
        }
    }

  /* Wait for images to come in and Z compare them. */
    first_incoming = 1;
    for (image = 0; image < tile_contribs[my_tile]; image++) {
        int idx;
        idx = icetCommWaitany(tile_contribs[my_tile], requests);
        incoming = icetSparseImageUnpackageFromReceive(incomingBuffers[idx]);
        if (first_incoming) {
            icetRaiseDebug1("Got first image (%d).", idx);
            icetDecompressImage(incoming, imageFragment);
            first_incoming = 0;
        } else {
            icetRaiseDebug1("Got subsequent image (%d).", idx);
            icetCompressedComposite(imageFragment, incoming, 1);
        }
    }

    if (icetIsEnabled(ICET_COLLECT_IMAGES)) {
        icetCollectImage(imageFragment,
                         my_tile,
                         tile_groups,
                         fullImage);
    } else {
        IceTSizeType offset;

        offset = (rank - tile_groups[my_tile])*my_fragment_size;

        /* Fragment might be truncated.  Adjust my_fragment_size
           appropriately. */
        my_fragment_size = icetImageGetNumPixels(imageFragment);

        icetImageCopyPixels(imageFragment,
                            0,
                            fullImage,
                            offset,
                            my_fragment_size);

        icetStateSetInteger(ICET_VALID_PIXELS_TILE, my_tile);
        icetStateSetInteger(ICET_VALID_PIXELS_OFFSET, offset);
        icetStateSetInteger(ICET_VALID_PIXELS_NUM, my_fragment_size);
    }

    return fullImage;
}